

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O2

uint32_t EOPLL_setMask(EOPLL *opll,uint32_t mask)

{
  uint32_t uVar1;
  
  if (opll != (EOPLL *)0x0) {
    uVar1 = opll->mask;
    opll->mask = mask;
    return uVar1;
  }
  return 0;
}

Assistant:

uint32_t EOPLL_setMask(EOPLL *opll, uint32_t mask) {
  uint32_t ret;

  if (opll) {
    ret = opll->mask;
    opll->mask = mask;
    return ret;
  } else
    return 0;
}